

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::calendar_impl::set_option
          (calendar_impl *this,calendar_option_type opt,int param_2)

{
  date_time_error *pdVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38;
  
  if (opt == is_dst) {
    pdVar1 = (date_time_error *)
             __cxa_allocate_exception
                       (0x30,CONCAT44(in_register_00000034,opt),
                        CONCAT44(in_register_00000014,param_2));
    std::__cxx11::string::string
              ((string *)&local_38,"is_dst is not settable options for calendar",&local_39);
    date_time_error::date_time_error(pdVar1,&local_38);
    __cxa_throw(pdVar1,&date_time_error::typeinfo,runtime_error::~runtime_error);
  }
  if (opt != is_gregorian) {
    return;
  }
  pdVar1 = (date_time_error *)
           __cxa_allocate_exception
                     (0x30,CONCAT44(in_register_00000034,opt),CONCAT44(in_register_00000014,param_2)
                     );
  std::__cxx11::string::string
            ((string *)&local_38,"is_gregorian is not settable options for calendar",&local_39);
  date_time_error::date_time_error(pdVar1,&local_38);
  __cxa_throw(pdVar1,&date_time_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

virtual void set_option(calendar_option_type opt,int /*v*/) 
        {
            switch(opt) {
            case is_gregorian:
                throw date_time_error("is_gregorian is not settable options for calendar");
            case is_dst:
                throw date_time_error("is_dst is not settable options for calendar");
            default:
                ;
            }
        }